

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O1

CURLcode Curl_read(Curl_easy *data,curl_socket_t sockfd,char *buf,size_t sizerequested,ssize_t *n)

{
  connectdata *pcVar1;
  ssize_t sVar2;
  ulong uVar3;
  bool bVar4;
  CURLcode result;
  CURLcode local_c;
  
  local_c = CURLE_RECV_ERROR;
  pcVar1 = data->conn;
  bVar4 = pcVar1->sock[1] == sockfd;
  *n = 0;
  uVar3 = (ulong)(data->set).buffer_size;
  if (uVar3 < sizerequested) {
    sizerequested = uVar3;
  }
  sVar2 = (*pcVar1->recv[bVar4])(data,(uint)bVar4,buf,sizerequested,&local_c);
  if (-1 < sVar2) {
    *n = *n + sVar2;
    local_c = CURLE_OK;
  }
  return local_c;
}

Assistant:

CURLcode Curl_read(struct Curl_easy *data,   /* transfer */
                   curl_socket_t sockfd,     /* read from this socket */
                   char *buf,                /* store read data here */
                   size_t sizerequested,     /* max amount to read */
                   ssize_t *n)               /* amount bytes read */
{
  CURLcode result = CURLE_RECV_ERROR;
  ssize_t nread = 0;
  size_t bytesfromsocket = 0;
  char *buffertofill = NULL;
  struct connectdata *conn = data->conn;

  /* Set 'num' to 0 or 1, depending on which socket that has been sent here.
     If it is the second socket, we set num to 1. Otherwise to 0. This lets
     us use the correct ssl handle. */
  int num = (sockfd == conn->sock[SECONDARYSOCKET]);

  *n = 0; /* reset amount to zero */

  bytesfromsocket = CURLMIN(sizerequested, (size_t)data->set.buffer_size);
  buffertofill = buf;

  nread = conn->recv[num](data, num, buffertofill, bytesfromsocket, &result);
  if(nread < 0)
    return result;

  *n += nread;

  return CURLE_OK;
}